

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileDescriptorProto::SharedDtor(FileDescriptorProto *this)

{
  internal::ArenaStringPtr::DestroyNoArena
            (&this->name_,(string *)internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->package_,(string *)internal::fixed_address_empty_string_abi_cxx11_);
  internal::ArenaStringPtr::DestroyNoArena
            (&this->syntax_,(string *)internal::fixed_address_empty_string_abi_cxx11_);
  if (this != (FileDescriptorProto *)_FileDescriptorProto_default_instance_) {
    if (this->options_ != (FileOptions *)0x0) {
      (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->source_code_info_ != (SourceCodeInfo *)0x0) {
      (*(this->source_code_info_->super_Message).super_MessageLite._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaNoVirtual() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  package_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  syntax_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
  if (this != internal_default_instance()) delete source_code_info_;
}